

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.h
# Opt level: O3

void interpolate<int(*)[2],PointPlotter<int>>
               (int (*p0) [2],int (*pn) [2],PointPlotter<int> plot,double res)

{
  int (*paiVar1) [2];
  int (*paiVar2) [2];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  
  paiVar1 = p0 + 2;
  if (paiVar1 != pn) {
    paiVar2 = p0 + 3;
    do {
      dVar4 = (double)p0[1][0];
      dVar5 = (double)(*paiVar1)[0];
      if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
        dVar6 = (double)(*p0)[0];
        dVar3 = (double)(*paiVar2)[0];
        if ((dVar6 != dVar4) || (NAN(dVar6) || NAN(dVar4))) {
          dVar10 = (double)(*paiVar1)[1];
          dVar6 = (dVar10 - (double)(*p0)[1]) / (dVar5 - dVar6);
          if ((dVar5 != dVar3) || (NAN(dVar5) || NAN(dVar3))) {
            dVar7 = (double)p0[1][1];
            dVar3 = ((double)(*paiVar2)[1] - dVar7) / (dVar3 - dVar4);
            dVar10 = dVar10 - dVar7;
          }
          else {
            dVar7 = (double)p0[1][1];
            dVar10 = dVar10 - dVar7;
            dVar3 = ((dVar10 * 3.0) / (dVar5 - dVar4) - dVar6) * 0.5;
          }
        }
        else {
          dVar7 = (double)p0[1][1];
          if ((dVar5 != dVar3) || (NAN(dVar5) || NAN(dVar3))) {
            dVar10 = (double)(*paiVar1)[1] - dVar7;
            auVar8._0_8_ = dVar10 * 3.0;
            auVar8._8_8_ = (double)(*paiVar2)[1] - dVar7;
            auVar9._8_8_ = dVar3 - dVar4;
            auVar9._0_8_ = dVar5 - dVar4;
            auVar9 = divpd(auVar8,auVar9);
            dVar3 = auVar9._8_8_;
            dVar6 = (auVar9._0_8_ - dVar3) * 0.5;
          }
          else {
            dVar10 = (double)(*paiVar1)[1] - dVar7;
            dVar3 = dVar10 / (dVar5 - dVar4);
            dVar6 = dVar3;
          }
        }
        dVar11 = dVar5 - dVar4;
        dVar10 = ((dVar6 + dVar3) - (dVar10 + dVar10) / dVar11) / (dVar11 * dVar11);
        if (dVar4 <= dVar5) {
          dVar3 = ((dVar4 + dVar5) * -3.0 * dVar10 + (dVar3 - dVar6) / dVar11) * 0.5;
          dVar12 = dVar3 + dVar3;
          dVar11 = (dVar10 * 6.0 * (dVar4 + res) + dVar12) * res * res;
          dVar6 = dVar6 - (dVar4 * 3.0 * dVar10 + dVar12) * dVar4;
          dVar12 = (dVar10 * 3.0 * (dVar4 + res) + dVar12) * dVar4 * res +
                   ((dVar10 * res + dVar3) * res + dVar6) * res;
          dVar3 = ((dVar10 * dVar4 + dVar3) * dVar4 + dVar6) * dVar4;
          dVar3 = (dVar7 - dVar3) + dVar3;
          do {
            dVar6 = 0.0;
            if (0.0 <= dVar3) {
              dVar6 = dVar3;
            }
            plot.f[(int)dVar4] = (int)dVar6;
            dVar3 = dVar3 + dVar12;
            dVar12 = dVar12 + dVar11;
            dVar11 = dVar11 + dVar10 * 6.0 * res * res * res;
            dVar4 = dVar4 + res;
          } while (dVar4 <= dVar5);
        }
      }
      p0 = p0 + 1;
      paiVar1 = paiVar1 + 1;
      paiVar2 = paiVar2 + 1;
    } while (paiVar1 != pn);
  }
  return;
}

Assistant:

inline
void interpolate(PointIter p0, PointIter pn, PointPlotter plot, double res)
{
  double k1, k2;

  // Set up points for first curve segment.
  PointIter p1 = p0; ++p1;
  PointIter p2 = p1; ++p2;
  PointIter p3 = p2; ++p3;

  // Draw each curve segment.
  for (; p2 != pn; ++p0, ++p1, ++p2, ++p3) {
    // p1 and p2 equal; single point.
    if (x(p1) == x(p2)) {
      continue;
    }
    // Both end points repeated; straight line.
    if (x(p0) == x(p1) && x(p2) == x(p3)) {
      k1 = k2 = (y(p2) - y(p1))/(x(p2) - x(p1));
    }
    // p0 and p1 equal; use f''(x1) = 0.
    else if (x(p0) == x(p1)) {
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
      k1 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k2)/2;
    }
    // p2 and p3 equal; use f''(x2) = 0.
    else if (x(p2) == x(p3)) {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k1)/2;
    }
    // Normal curve.
    else {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
    }

    interpolate_segment(x(p1), y(p1), x(p2), y(p2), k1, k2, plot, res);
  }
}